

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O0

void emit_bits(phuff_entropy_ptr entropy,uint code,int size)

{
  undefined1 *puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  int c;
  int put_bits;
  size_t put_buffer;
  ulong local_18;
  
  iVar3 = *(int *)(in_RDI + 0x48);
  if (in_EDX == 0) {
    *(undefined4 *)(**(long **)(in_RDI + 0x50) + 0x28) = 0x28;
    (**(code **)**(undefined8 **)(in_RDI + 0x50))(*(undefined8 *)(in_RDI + 0x50));
  }
  if (*(int *)(in_RDI + 0x28) == 0) {
    iVar3 = in_EDX + iVar3;
    local_18 = *(ulong *)(in_RDI + 0x40) |
               ((1L << ((byte)in_EDX & 0x3f)) - 1U & (ulong)in_ESI) << (0x18U - (char)iVar3 & 0x3f);
    for (; 7 < iVar3; iVar3 = iVar3 + -8) {
      uVar2 = (uint)(local_18 >> 0x10);
      uVar4 = uVar2 & 0xff;
      puVar1 = *(undefined1 **)(in_RDI + 0x30);
      *(undefined1 **)(in_RDI + 0x30) = puVar1 + 1;
      *puVar1 = (char)(local_18 >> 0x10);
      lVar5 = *(long *)(in_RDI + 0x38) + -1;
      *(long *)(in_RDI + 0x38) = lVar5;
      if (lVar5 == 0) {
        dump_buffer((phuff_entropy_ptr)(CONCAT44(iVar3,uVar2) & 0xffffffff000000ff));
      }
      if (uVar4 == 0xff) {
        puVar1 = *(undefined1 **)(in_RDI + 0x30);
        *(undefined1 **)(in_RDI + 0x30) = puVar1 + 1;
        *puVar1 = 0;
        lVar5 = *(long *)(in_RDI + 0x38) + -1;
        *(long *)(in_RDI + 0x38) = lVar5;
        if (lVar5 == 0) {
          dump_buffer((phuff_entropy_ptr)CONCAT44(iVar3,0xff));
        }
      }
      local_18 = local_18 << 8;
    }
    *(ulong *)(in_RDI + 0x40) = local_18;
    *(int *)(in_RDI + 0x48) = iVar3;
  }
  return;
}

Assistant:

LOCAL(void)
emit_bits(phuff_entropy_ptr entropy, unsigned int code, int size)
/* Emit some bits, unless we are in gather mode */
{
  /* This routine is heavily used, so it's worth coding tightly. */
  register size_t put_buffer = (size_t)code;
  register int put_bits = entropy->put_bits;

  /* if size is 0, caller used an invalid Huffman table entry */
  if (size == 0)
    ERREXIT(entropy->cinfo, JERR_HUFF_MISSING_CODE);

  if (entropy->gather_statistics)
    return;                     /* do nothing if we're only getting stats */

  put_buffer &= (((size_t)1) << size) - 1; /* mask off any extra bits in code */

  put_bits += size;             /* new number of bits in buffer */

  put_buffer <<= 24 - put_bits; /* align incoming bits */

  put_buffer |= entropy->put_buffer; /* and merge with old buffer contents */

  while (put_bits >= 8) {
    int c = (int)((put_buffer >> 16) & 0xFF);

    emit_byte(entropy, c);
    if (c == 0xFF) {            /* need to stuff a zero byte? */
      emit_byte(entropy, 0);
    }
    put_buffer <<= 8;
    put_bits -= 8;
  }

  entropy->put_buffer = put_buffer; /* update variables */
  entropy->put_bits = put_bits;
}